

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this,Permutation *permutation)

{
  int iVar1;
  int iVar2;
  reference this_00;
  reference pvVar3;
  value_type local_54;
  int local_4c;
  allocator<std::vector<Fraction,_std::allocator<Fraction>_>_> local_45;
  int i;
  allocator<Fraction> local_31;
  vector<Fraction,_std::allocator<Fraction>_> local_30;
  Permutation *local_18;
  Permutation *permutation_local;
  Matrix *this_local;
  
  local_18 = permutation;
  permutation_local = (Permutation *)this;
  iVar1 = Permutation::Size(permutation);
  this->n_ = iVar1;
  iVar1 = Permutation::Size(local_18);
  this->m_ = iVar1;
  iVar1 = Permutation::Size(local_18);
  iVar2 = Permutation::Size(local_18);
  std::allocator<Fraction>::allocator(&local_31);
  std::vector<Fraction,_std::allocator<Fraction>_>::vector(&local_30,(long)iVar2,&local_31);
  std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>::allocator(&local_45);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::vector(&this->elements_,(long)iVar1,&local_30,&local_45);
  std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>::~allocator(&local_45);
  std::vector<Fraction,_std::allocator<Fraction>_>::~vector(&local_30);
  std::allocator<Fraction>::~allocator(&local_31);
  for (local_4c = 0; local_4c < this->n_; local_4c = local_4c + 1) {
    Fraction::Fraction(&local_54,1);
    this_00 = std::
              vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
              ::operator[](&this->elements_,(long)local_4c);
    iVar1 = Permutation::At(local_18,local_4c);
    pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](this_00,(long)iVar1);
    *pvVar3 = local_54;
  }
  return;
}

Assistant:

Matrix::Matrix(const Permutation& permutation)
    : n_(permutation.Size()), m_(permutation.Size()),
      elements_(std::vector<std::vector<Fraction>>(
          permutation.Size(), std::vector<Fraction>(permutation.Size()))) {
  for (int i = 0; i < n_; i++) {
    elements_[i][permutation.At(i)] = 1;
  }
}